

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# art_internal_impl.hpp
# Opt level: O2

find_result __thiscall
unodb::detail::
basic_inode_16<unodb::detail::basic_art_policy<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>,_unodb::olc_db,_unodb::in_critical_section,_unodb::optimistic_lock,_unodb::optimistic_lock::read_critical_section,_unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>,_unodb::detail::olc_inode_defs,_unodb::detail::db_inode_qsbr_deleter,_unodb::detail::db_leaf_qsbr_deleter>_>
::find_child(basic_inode_16<unodb::detail::basic_art_policy<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>,_unodb::olc_db,_unodb::in_critical_section,_unodb::optimistic_lock,_unodb::optimistic_lock::read_critical_section,_unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>,_unodb::detail::olc_inode_defs,_unodb::detail::db_inode_qsbr_deleter,_unodb::detail::db_leaf_qsbr_deleter>_>
             *this,byte key_byte)

{
  uint uVar1;
  uint uVar2;
  in_critical_section<unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>_> *piVar3;
  undefined1 auVar4 [16];
  find_result fVar5;
  
  auVar4[1] = key_byte;
  auVar4[0] = key_byte;
  auVar4[2] = key_byte;
  auVar4[3] = key_byte;
  auVar4[4] = key_byte;
  auVar4[5] = key_byte;
  auVar4[6] = key_byte;
  auVar4[7] = key_byte;
  auVar4[8] = key_byte;
  auVar4[9] = key_byte;
  auVar4[10] = key_byte;
  auVar4[0xb] = key_byte;
  auVar4[0xc] = key_byte;
  auVar4[0xd] = key_byte;
  auVar4[0xe] = key_byte;
  auVar4[0xf] = key_byte;
  auVar4 = vpcmpeqb_avx(auVar4,(undefined1  [16])this->keys);
  uVar2 = (uint)(ushort)((ushort)(SUB161(auVar4 >> 7,0) & 1) |
                         (ushort)(SUB161(auVar4 >> 0xf,0) & 1) << 1 |
                         (ushort)(SUB161(auVar4 >> 0x17,0) & 1) << 2 |
                         (ushort)(SUB161(auVar4 >> 0x1f,0) & 1) << 3 |
                         (ushort)(SUB161(auVar4 >> 0x27,0) & 1) << 4 |
                         (ushort)(SUB161(auVar4 >> 0x2f,0) & 1) << 5 |
                         (ushort)(SUB161(auVar4 >> 0x37,0) & 1) << 6 |
                         (ushort)(SUB161(auVar4 >> 0x3f,0) & 1) << 7 |
                         (ushort)(SUB161(auVar4 >> 0x47,0) & 1) << 8 |
                         (ushort)(SUB161(auVar4 >> 0x4f,0) & 1) << 9 |
                         (ushort)(SUB161(auVar4 >> 0x57,0) & 1) << 10 |
                         (ushort)(SUB161(auVar4 >> 0x5f,0) & 1) << 0xb |
                         (ushort)(SUB161(auVar4 >> 0x67,0) & 1) << 0xc |
                         (ushort)(SUB161(auVar4 >> 0x6f,0) & 1) << 0xd |
                         (ushort)(SUB161(auVar4 >> 0x77,0) & 1) << 0xe |
                        (ushort)(byte)(auVar4[0xf] >> 7) << 0xf) &
          ~(-1 << ((this->
                   super_basic_inode_16_parent<unodb::detail::basic_art_policy<unsigned_long,_std::span<const_std::byte>,_unodb::olc_db,_unodb::in_critical_section,_unodb::optimistic_lock,_unodb::optimistic_lock::read_critical_section,_unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>,_unodb::detail::olc_inode_defs,_unodb::detail::db_inode_qsbr_deleter,_unodb::detail::db_leaf_qsbr_deleter>_>
                   ).
                   super_basic_inode_impl<unodb::detail::basic_art_policy<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>,_unodb::olc_db,_unodb::in_critical_section,_unodb::optimistic_lock,_unodb::optimistic_lock::read_critical_section,_unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>,_unodb::detail::olc_inode_defs,_unodb::detail::db_inode_qsbr_deleter,_unodb::detail::db_leaf_qsbr_deleter>_>
                   .children_count.value.super___atomic_base<unsigned_char>._M_i & 0x1f));
  uVar1 = 0;
  if (uVar2 != 0) {
    for (; (uVar2 >> uVar1 & 1) == 0; uVar1 = uVar1 + 1) {
    }
  }
  fVar5.first = (byte)-(uint)(uVar2 == 0) | (byte)uVar1;
  fVar5._1_3_ = (int3)(-(uint)(uVar2 == 0) >> 8);
  fVar5._4_4_ = 0;
  piVar3 = (in_critical_section<unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>_> *)
           0x0;
  if (uVar2 != 0) {
    piVar3 = (this->children)._M_elems + uVar1;
  }
  fVar5.second = piVar3;
  return fVar5;
}

Assistant:

[[nodiscard, gnu::pure]] constexpr find_result find_child(
      std::byte key_byte) noexcept {
#ifdef UNODB_DETAIL_X86_64
    const auto replicated_search_key =
        _mm_set1_epi8(static_cast<char>(key_byte));
    const auto matching_key_positions =
        _mm_cmpeq_epi8(replicated_search_key, keys.byte_vector);
    const auto mask = (1U << this->children_count) - 1;
    const auto bit_field =
        static_cast<unsigned>(_mm_movemask_epi8(matching_key_positions)) & mask;
    if (bit_field != 0) {
      const auto i = detail::ctz(bit_field);
      return std::make_pair(
          i, static_cast<critical_section_policy<node_ptr> *>(&children[i]));
    }
    return parent_class::child_not_found;
#elif defined(__aarch64__)
    const auto replicated_search_key =
        vdupq_n_u8(static_cast<std::uint8_t>(key_byte));
    const auto matching_key_positions =
        vceqq_u8(replicated_search_key, keys.byte_vector);
    const auto narrowed_positions =
        vshrn_n_u16(vreinterpretq_u16_u8(matching_key_positions), 4);
    const auto scalar_pos =
        // NOLINTNEXTLINE(misc-const-correctness)
        vget_lane_u64(vreinterpret_u64_u8(narrowed_positions), 0);
    const auto child_count = this->children_count.load();
    const auto mask = (child_count == 16) ? 0xFFFFFFFF'FFFFFFFFULL
                                          : (1ULL << (child_count << 2U)) - 1;
    const auto masked_pos = scalar_pos & mask;

    if (masked_pos == 0) return parent_class::child_not_found;

    const auto i = static_cast<unsigned>(detail::ctz(masked_pos) >> 2U);
    return std::make_pair(
        i, static_cast<critical_section_policy<node_ptr> *>(&children[i]));
#else
    for (size_t i = 0; i < this->children_count.load(); ++i)
      if (key_byte == keys.byte_array[i])
        return std::make_pair(
            i, static_cast<critical_section_policy<node_ptr> *>(&children[i]));
    return parent_class::child_not_found;
#endif
  }